

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O2

Sim * __thiscall r_exec::Pred::get_simulation(Pred *this,Controller *root)

{
  atomic_int_fast64_t *paVar1;
  pointer pPVar2;
  Sim *pSVar3;
  Controller *pCVar4;
  pointer pPVar5;
  P<r_exec::Sim> simulation;
  P<r_exec::Sim> local_38;
  
  pPVar5 = (this->simulations).
           super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->simulations).
           super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pPVar5 == pPVar2) {
      return (Sim *)0x0;
    }
    pSVar3 = (Sim *)pPVar5->object;
    LOCK();
    paVar1 = &(pSVar3->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    pCVar4 = (Controller *)(pSVar3->root).object;
    local_38.object = (_Object *)pSVar3;
    core::P<r_exec::Sim>::~P(&local_38);
    pPVar5 = pPVar5 + 1;
  } while (pCVar4 != root);
  return pSVar3;
}

Assistant:

Sim *Pred::get_simulation(Controller *root) const
{
    for (P<Sim> simulation : simulations) {
        if (simulation->root == root) {
            return simulation;
        }
    }

    return nullptr;
}